

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O1

void __thiscall libchars::edit_object::~edit_object(edit_object *this)

{
  size_t *psVar1;
  pointer pcVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  this->_vptr_edit_object = (_func_int **)&PTR__edit_object_00104d10;
  if (this->buflen != 0) {
    pcVar3 = this->buffer + (this->buflen - 1);
    do {
      *pcVar3 = '\0';
      pcVar3 = pcVar3 + -1;
      psVar1 = &this->buflen;
      *psVar1 = *psVar1 - 1;
    } while (*psVar1 != 0);
  }
  pcVar2 = (this->prompt)._M_dataplus._M_p;
  paVar4 = &(this->prompt).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~edit_object() {
            // securely wipe contents of buffer
            if (buflen > 0) {
                volatile char *p = buffer + buflen - 1;
                while (buflen > 0) {
                    *p-- = 0;
                    --buflen;
                }
            }
        }